

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

FSerializer * Serialize(FSerializer *arc,char *key,double *value,double *defval)

{
  bool bVar1;
  Value *this;
  double dVar2;
  Value *val;
  double *defval_local;
  double *value_local;
  char *key_local;
  FSerializer *arc_local;
  
  bVar1 = FSerializer::isWriting(arc);
  if (bVar1) {
    bVar1 = FWriter::inObject(arc->w);
    if ((((!bVar1) || (defval == (double *)0x0)) || (*value != *defval)) ||
       (NAN(*value) || NAN(*defval))) {
      FSerializer::WriteKey(arc,key);
      FWriter::Double(arc->w,*value);
    }
  }
  else {
    this = FReader::FindKey(arc->r,key);
    if (this != (Value *)0x0) {
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsDouble(this);
      if (!bVar1) {
        __assert_fail("val->IsDouble()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                      ,0x578,
                      "FSerializer &Serialize(FSerializer &, const char *, double &, double *)");
      }
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsDouble(this);
      if (bVar1) {
        dVar2 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetDouble(this);
        *value = dVar2;
      }
      else {
        Printf("\x1cGfloat type expected for \'%s\'",key);
        arc->mErrors = arc->mErrors + 1;
      }
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, double &value, double *defval)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || defval == nullptr || value != *defval)
		{
			arc.WriteKey(key);
			arc.w->Double(value);
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			assert(val->IsDouble());
			if (val->IsDouble())
			{
				value = val->GetDouble();
			}
			else
			{
				Printf(TEXTCOLOR_RED "float type expected for '%s'", key);
				arc.mErrors++;
			}
		}
	}
	return arc;
}